

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O0

void Diligent::
     FormatStrSS<std::__cxx11::stringstream,char[34],std::__cxx11::string,char[2],std::__cxx11::string,char[2],unsigned_int,char[27],std::__cxx11::string>
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss,
               char (*FirstArg) [34],
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *RestArgs,
               char (*RestArgs_1) [2],
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *RestArgs_2,
               char (*RestArgs_3) [2],uint *RestArgs_4,char (*RestArgs_5) [27],
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *RestArgs_6)

{
  char (*RestArgs_local_3) [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *RestArgs_local_2;
  char (*RestArgs_local_1) [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *RestArgs_local;
  char (*FirstArg_local) [34];
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss_local;
  
  FormatStrSS<std::__cxx11::stringstream,char[34]>(ss,FirstArg);
  FormatStrSS<std::__cxx11::stringstream,std::__cxx11::string,char[2],std::__cxx11::string,char[2],unsigned_int,char[27],std::__cxx11::string>
            (ss,RestArgs,RestArgs_1,RestArgs_2,RestArgs_3,RestArgs_4,RestArgs_5,RestArgs_6);
  return;
}

Assistant:

void FormatStrSS(SSType& ss, const FirstArgType& FirstArg, const RestArgsType&... RestArgs)
{
    FormatStrSS(ss, FirstArg);
    FormatStrSS(ss, RestArgs...); // recursive call using pack expansion syntax
}